

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O1

void decompressBlockETC2c
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  if ((block_part1 & 2) == 0) {
    decompressBlockDiffFlipC(block_part1,block_part2,img,width,starty,startx,starty,channels);
  }
  else if (((int)(block_part1 << 5) >> 0x1d) + (block_part1 >> 0x1b) < 0x20) {
    if (((int)(block_part1 << 0xd) >> 0x1d) + (block_part1 >> 0x13 & 0x1f) < 0x20) {
      if (((int)(block_part1 << 0x15) >> 0x1d) + (block_part1 >> 0xb & 0x1f) < 0x20) {
        decompressBlockDiffFlipC(block_part1,block_part2,img,width,starty,startx,starty,channels);
        return;
      }
      decompressBlockPlanar57c
                ((block_part1 & 0x3fc) << 6 |
                 block_part1 << 5 & 0x30000 |
                 (block_part1 & 0x7f0000) * 4 + (block_part1 & 0xff000000) * 2 |
                 (block_part1 & 1) << 7 | block_part2 >> 0x19,block_part2 << 7,img,width,starty,
                 startx,starty,channels);
    }
    else {
      decompressBlockTHUMB58Hc
                (block_part1 >> 1 & 0x1fffe |
                 block_part1 >> 2 & 0x60000 | block_part1 & 1 | block_part1 >> 5 & 0x3f80000,
                 block_part2,img,width,starty,startx,starty,channels);
    }
  }
  else {
    decompressBlockTHUMB59Tc
              (block_part1 >> 2 & 0x6000000 | block_part1 & 1 | block_part1 >> 1 & 0x1fffffe,
               block_part2,img,width,starty,startx,starty,channels);
  }
  return;
}

Assistant:

void decompressBlockETC2c(unsigned int block_part1, unsigned int block_part2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	int diffbit;
	signed char color1[3];
	signed char diff[3];
	signed char red, green, blue;

	diffbit = (GETBITSHIGH(block_part1, 1, 33));

	if( diffbit )
	{
		// We have diffbit = 1;

		// Base color
		color1[0]= GETBITSHIGH(block_part1, 5, 63);
		color1[1]= GETBITSHIGH(block_part1, 5, 55);
		color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Diff color
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		red   = color1[0] + diff[0];
		green = color1[1] + diff[1];
		blue  = color1[2] + diff[2];

		if(red < 0 || red > 31)
		{
			unsigned int block59_part1, block59_part2;
			unstuff59bits(block_part1, block_part2, block59_part1, block59_part2);
			decompressBlockTHUMB59Tc(block59_part1, block59_part2, img, width, height, startx, starty, channels);
		}
		else if (green < 0 || green > 31)
		{
			unsigned int block58_part1, block58_part2;
			unstuff58bits(block_part1, block_part2, block58_part1, block58_part2);
			decompressBlockTHUMB58Hc(block58_part1, block58_part2, img, width, height, startx, starty, channels);
		}
		else if(blue < 0 || blue > 31)
		{
			unsigned int block57_part1, block57_part2;

			unstuff57bits(block_part1, block_part2, block57_part1, block57_part2);
			decompressBlockPlanar57c(block57_part1, block57_part2, img, width, height, startx, starty, channels);
		}
		else
		{
 			decompressBlockDiffFlipC(block_part1, block_part2, img, width, height, startx, starty, channels);
		}
	}
	else
	{
		// We have diffbit = 0;
		decompressBlockDiffFlipC(block_part1, block_part2, img, width, height, startx, starty, channels);
	}
}